

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::t_formatter::format(t_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  long lVar1;
  uint uVar2;
  char *pcVar3;
  char *__src;
  ptrdiff_t _Num;
  size_t sVar4;
  ulong uVar5;
  scoped_pad p;
  scoped_pad local_70;
  format_int local_48;
  
  uVar5 = msg->thread_id;
  if ((this->super_flag_formatter).padinfo_.width_ == 0) {
    __src = fmt::v5::format_int::format_decimal((format_int *)&local_70,uVar5);
    pcVar3 = (char *)((long)&local_70.total_pad_ + 5);
    sVar4 = (long)pcVar3 - (long)__src;
    uVar5 = (dest->super_basic_buffer<char>).size_ + sVar4;
    local_70.spaces_.data_ = __src;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar5);
    }
    if (pcVar3 != __src) {
      memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,__src,
              sVar4);
    }
    (dest->super_basic_buffer<char>).size_ = uVar5;
  }
  else {
    lVar1 = 0x3f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    scoped_pad::scoped_pad
              (&local_70,
               (ulong)((uVar2 + 1) -
                      (uint)(uVar5 < *(ulong *)(fmt::v5::internal::basic_data<void>::
                                                ZERO_OR_POWERS_OF_10_64 + (ulong)uVar2 * 8))),
               &(this->super_flag_formatter).padinfo_,dest);
    pcVar3 = fmt::v5::format_int::format_decimal(&local_48,msg->thread_id);
    sVar4 = (long)(local_48.buffer_ + 0x15) - (long)pcVar3;
    uVar5 = (dest->super_basic_buffer<char>).size_ + sVar4;
    local_48.str_ = pcVar3;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar5);
    }
    if (local_48.buffer_ + 0x15 != pcVar3) {
      memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,pcVar3,
              sVar4);
    }
    (dest->super_basic_buffer<char>).size_ = uVar5;
    scoped_pad::~scoped_pad(&local_70);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            const auto field_size = fmt_helper::count_digits(msg.thread_id);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(msg.thread_id, dest);
        }
        else
        {
            fmt_helper::append_int(msg.thread_id, dest);
        }
    }